

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

int __thiscall llvm::APInt::compare(APInt *this,APInt *RHS)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = this->BitWidth;
  if (uVar1 != RHS->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be same for comparison\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x113,"int llvm::APInt::compare(const APInt &) const");
  }
  if (uVar1 < 0x41) {
    uVar1 = 0xffffffff;
    if ((RHS->U).VAL <= (this->U).VAL) {
      uVar1 = (uint)((RHS->U).VAL < (this->U).VAL);
    }
    return uVar1;
  }
  iVar2 = tcCompare((this->U).pVal,(RHS->U).pVal,(uint)((ulong)uVar1 + 0x3f >> 6));
  return iVar2;
}

Assistant:

int APInt::compare(const APInt& RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be same for comparison");
  if (isSingleWord())
    return U.VAL < RHS.U.VAL ? -1 : U.VAL > RHS.U.VAL;

  return tcCompare(U.pVal, RHS.U.pVal, getNumWords());
}